

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneevent.cpp
# Opt level: O0

void __thiscall QGraphicsSceneEvent::QGraphicsSceneEvent(QGraphicsSceneEvent *this,Type type)

{
  QGraphicsSceneEventPrivate *pQVar1;
  Type in_ESI;
  QGraphicsSceneEvent *in_RDI;
  
  QEvent::QEvent(&in_RDI->super_QEvent,in_ESI);
  *(undefined ***)in_RDI = &PTR__QGraphicsSceneEvent_00d34a60;
  pQVar1 = (QGraphicsSceneEventPrivate *)operator_new(0x20);
  QGraphicsSceneEventPrivate::QGraphicsSceneEventPrivate(pQVar1);
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>::
  QScopedPointer(&in_RDI->d_ptr,pQVar1);
  pQVar1 = QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
           ::operator->(&in_RDI->d_ptr);
  pQVar1->q_ptr = in_RDI;
  return;
}

Assistant:

QGraphicsSceneEvent::QGraphicsSceneEvent(Type type)
    : QEvent(type), d_ptr(new QGraphicsSceneEventPrivate)
{
    d_ptr->q_ptr = this;
}